

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

int __thiscall capnp::_::OrphanBuilder::truncate(OrphanBuilder *this,char *__file,__off_t __length)

{
  anon_union_4_5_35ddcec3_for_WirePointer_1 *paVar1;
  ushort uVar2;
  ushort uVar3;
  word *pwVar4;
  StructSize elementSize;
  PointerBuilder other;
  StructBuilder other_00;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  Disposer *pDVar8;
  uint uVar9;
  int iVar10;
  SegmentBuilder *pSVar12;
  long lVar13;
  undefined8 *puVar14;
  Exception *pEVar15;
  WirePointer *pWVar16;
  ulong uVar17;
  undefined7 uVar19;
  Exception *__return_storage_ptr__;
  Exception *pEVar18;
  ElementSize elementSize_00;
  BuilderArena *this_00;
  Exception *pEVar20;
  WirePointer *pWVar21;
  void *__s;
  uint elementCount;
  uint uVar22;
  uint uVar23;
  uint i;
  uint uVar24;
  WirePointer *pWVar25;
  ulong uVar26;
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> _kjCondition;
  Fault f;
  OrphanBuilder replacement;
  word *newEndWord;
  Context *local_138;
  undefined1 local_118 [24];
  ulong local_100;
  uint local_f8;
  undefined2 local_f4;
  Exception *local_f0;
  undefined1 local_e8 [64];
  SegmentBuilder *local_a8;
  Context *local_a0;
  word *local_98;
  undefined1 local_90 [40];
  CapTableBuilder *pCStack_68;
  WirePointer *local_60;
  WirePointer *pWStack_58;
  int local_50;
  undefined2 uStack_4c;
  undefined2 uStack_4a;
  Context *local_48;
  CapTableBuilder *pCStack_40;
  WirePointer *local_38;
  Exception *pEVar11;
  
  uVar23 = (uint)__file;
  if (0x1fffffff < uVar23) {
    truncate::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)this);
LAB_0019a3e8:
    SegmentBuilder::throwNotWritable((SegmentBuilder *)local_138);
  }
  uVar17 = (ulong)__file & 0xffffffff;
  local_138 = (Context *)this->segment;
  if (((this->tag).content & 3) == 2) {
    this_00 = (BuilderArena *)((SegmentReader *)&local_138->file)->arena;
    local_138 = (Context *)
                BuilderArena::getSegment
                          (this_00,(SegmentId)*(uint *)((long)&(this->tag).content + 4));
    uVar9 = (uint)(this->tag).content;
    pwVar4 = (word *)(local_138->description).content.ptr;
    uVar26 = (ulong)(uVar9 & 0xfffffff8);
    pEVar11 = (Exception *)((long)&pwVar4->content + uVar26);
    pEVar18 = (Exception *)((long)&pwVar4[1].content + uVar26);
    if ((uVar9 & 4) == 0) {
      pWVar21 = (WirePointer *)
                (pEVar18->trace + (long)(*(int *)&(pEVar11->ownFile).content.ptr >> 2) + -0xd);
      pEVar18 = pEVar11;
    }
    else {
      this_00 = (BuilderArena *)((SegmentReader *)&local_138->file)->arena;
      local_138 = (Context *)
                  BuilderArena::getSegment
                            (this_00,(SegmentId)*(uint *)((long)&(pEVar11->ownFile).content.ptr + 4)
                            );
      pWVar21 = (WirePointer *)
                ((long)&((word *)(local_138->description).content.ptr)->content +
                (ulong)(*(uint *)&(pEVar11->ownFile).content.ptr & 0xfffffff8));
    }
  }
  else {
    pWVar21 = (WirePointer *)this->location;
    pEVar18 = (Exception *)this;
    this_00 = (BuilderArena *)this;
  }
  if (*(bool *)&(local_138->next).ptr.ptr == true) goto LAB_0019a3e8;
  uVar19 = (undefined7)((ulong)pEVar18 >> 8);
  if (*(int *)((long)&(pEVar18->ownFile).content.ptr + 4) == 0 &&
      *(int *)&(pEVar18->ownFile).content.ptr == 0) {
    return (int)CONCAT71(uVar19,uVar23 == 0);
  }
  local_118._0_4_ = *(uint *)&(pEVar18->ownFile).content.ptr & 3;
  local_118._4_4_ = 1;
  local_118._8_8_ = " == ";
  local_118._16_8_ = (byte *)0x5;
  local_100 = CONCAT71(local_100._1_7_,local_118._0_4_ == 1);
  if (local_118._0_4_ != 1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[42]>
              ((Fault *)local_e8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0xe6d,FAILED,"ref->kind() == WirePointer::LIST",
               "_kjCondition,\"Schema mismatch: Can\'t truncate non-list.\"",
               (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
               local_118,(char (*) [42])"Schema mismatch: Can\'t truncate non-list.");
    goto LAB_00199ca1;
  }
  if ((char)__length != '\0') {
    if (uVar23 != 0x1fffffff) {
      uVar17 = (ulong)(uVar23 + 1);
      goto LAB_00199bb9;
    }
    truncate::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)this_00);
LAB_0019a3f7:
    truncate::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)this_00);
LAB_0019a3fc:
    truncate::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)this_00);
LAB_0019a401:
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::word*&,capnp::word*&>&>
              ((Fault *)(local_e8 + 0x38),
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0xea1,FAILED,"newEndWord >= expectedEnd","_kjCondition,",
               (DebugComparison<capnp::word_*&,_capnp::word_*&> *)local_118);
    kj::_::Debug::Fault::fatal((Fault *)(local_e8 + 0x38));
  }
LAB_00199bb9:
  uVar23 = *(uint *)((long)&(pEVar18->ownFile).content.ptr + 4);
  elementSize_00 = (ElementSize)uVar23 & INLINE_COMPOSITE;
  uVar9 = uVar23 >> 3;
  pEVar11 = (Exception *)(ulong)uVar9;
  elementCount = (uint)uVar17;
  if (elementSize_00 == POINTER) {
    pWVar16 = pWVar21 + uVar17;
    uVar17 = (ulong)uVar9;
    pWVar25 = pWVar21 + uVar17;
    if (elementCount <= uVar9) {
      pWVar21 = pWVar16;
      if (elementCount < uVar9) {
        do {
          if ((((pWVar21->offsetAndKind).value & 3) == 2) &&
             (pSVar12 = BuilderArena::getSegment
                                  ((BuilderArena *)((SegmentReader *)&local_138->file)->arena,
                                   (SegmentId)(pWVar21->field_1).structRef),
             pSVar12->readOnly == false)) {
            uVar23 = (pWVar21->offsetAndKind).value;
            puVar14 = (undefined8 *)
                      ((long)&((pSVar12->super_SegmentReader).ptr.ptr)->content +
                      (ulong)(uVar23 & 0xfffffff8));
            if ((uVar23 & 4) == 0) {
              *puVar14 = 0;
            }
            else {
              *puVar14 = 0;
              puVar14[1] = 0;
            }
          }
          pWVar21->offsetAndKind = 0;
          pWVar21->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
          pWVar21 = pWVar21 + 1;
        } while (pWVar21 < pWVar25);
      }
      iVar10 = elementCount * 8 + 6;
LAB_00199f60:
      *(int *)((long)&(pEVar18->ownFile).content.ptr + 4) = iVar10;
      iVar10 = (int)CONCAT71(uVar19,1);
      if ((WirePointer *)(local_138->next).ptr.disposer != pWVar25) {
        return iVar10;
      }
      (local_138->next).ptr.disposer = (Disposer *)pWVar16;
      return iVar10;
    }
    if ((((WirePointer *)(local_138->next).ptr.disposer == pWVar25) && (uVar9 <= elementCount)) &&
       (pWVar16 <=
        (WirePointer *)
        ((word *)(local_138->description).content.ptr + (local_138->description).content.size_))) {
      (local_138->next).ptr.disposer = (Disposer *)pWVar16;
      iVar10 = elementCount * 8 + 6;
LAB_0019a28b:
      *(int *)((long)&(pEVar18->ownFile).content.ptr + 4) = iVar10;
      goto LAB_00199ec1;
    }
    __return_storage_ptr__ = (Exception *)local_e8;
    initList((OrphanBuilder *)__return_storage_ptr__,
             (BuilderArena *)((SegmentReader *)&local_138->file)->arena,this->capTable,elementCount,
             POINTER);
    asList((ListBuilder *)local_118,(OrphanBuilder *)__return_storage_ptr__,POINTER);
    uVar7 = local_118._16_8_;
    uVar6 = local_118._8_8_;
    uVar5 = local_118._0_8_;
    if (7 < uVar23) {
      uVar26 = local_100 >> 0x20;
      __return_storage_ptr__ = (Exception *)0x0;
      do {
        local_a0 = (Context *)(uVar7 + ((ulong)__return_storage_ptr__ >> 3));
        local_e8._56_8_ = uVar5;
        local_a8 = (SegmentBuilder *)uVar6;
        pCStack_40 = this->capTable;
        local_48 = local_138;
        other.capTable = pCStack_40;
        other.segment = (SegmentBuilder *)local_138;
        other.pointer = pWVar21;
        local_38 = pWVar21;
        PointerBuilder::transferFrom((PointerBuilder *)(local_e8 + 0x38),other);
        __return_storage_ptr__ =
             (Exception *)((long)__return_storage_ptr__->trace + (uVar26 - 0x68));
        pWVar21 = pWVar21 + 1;
        uVar17 = uVar17 - 1;
      } while (uVar17 != 0);
    }
    if (this->segment != (SegmentBuilder *)0x0) {
      euthanize(this);
    }
LAB_00199e8d:
    this->segment = (SegmentBuilder *)local_e8._8_8_;
    this->capTable = (CapTableBuilder *)local_e8._16_8_;
    this->location = (word *)local_e8._24_8_;
    local_e8._56_8_ = local_e8._0_8_;
  }
  else {
    uVar23 = uVar23 & 7;
    if (uVar23 != 7) {
      __return_storage_ptr__ = (Exception *)(ulong)elementSize_00;
      lVar13 = uVar17 * (uint)(&BITS_PER_ELEMENT_TABLE)[(long)__return_storage_ptr__];
      uVar17 = lVar13 + 0x3fU >> 6;
      pWVar16 = pWVar21 + uVar17;
      uVar26 = (long)pEVar11 * (ulong)(uint)(&BITS_PER_ELEMENT_TABLE)[(long)__return_storage_ptr__]
               + 0x3f >> 6;
      pWVar25 = pWVar21 + uVar26;
      if (elementCount <= uVar9) {
        __s = (void *)((long)pWVar21 + ((lVar13 + 7U >> 3) - (__length & 0xffU)));
        uVar17 = (long)pWVar25 - (long)__s;
        if ((int)uVar17 != 0) {
          memset(__s,0,uVar17 & 0xffffffff);
        }
        iVar10 = uVar23 + elementCount * 8;
        goto LAB_00199f60;
      }
      if ((((WirePointer *)(local_138->next).ptr.disposer == pWVar25) && (uVar26 <= uVar17)) &&
         (pWVar16 <=
          (WirePointer *)
          ((word *)(local_138->description).content.ptr + (local_138->description).content.size_)))
      {
        (local_138->next).ptr.disposer = (Disposer *)pWVar16;
        iVar10 = uVar23 + elementCount * 8;
        goto LAB_0019a28b;
      }
      initList((OrphanBuilder *)local_e8,(BuilderArena *)((SegmentReader *)&local_138->file)->arena,
               this->capTable,elementCount,elementSize_00);
      asList((ListBuilder *)local_118,(OrphanBuilder *)local_e8,elementSize_00);
      if ((int)uVar26 != 0) {
        memcpy((void *)local_118._16_8_,pWVar21,(ulong)(uint)((int)uVar26 << 3));
      }
      if (this->segment != (SegmentBuilder *)0x0) {
        euthanize(this);
      }
      goto LAB_00199e8d;
    }
    local_118._0_4_ = (pWVar21->offsetAndKind).value & 3;
    local_118._4_4_ = 0;
    local_118._8_8_ = " == ";
    local_118._16_8_ = (byte *)0x5;
    local_100 = CONCAT71(local_100._1_7_,local_118._0_4_ == 0);
    if (local_118._0_4_ != 0) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[61]>
                ((Fault *)local_e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0xe7f,FAILED,"tag->kind() == WirePointer::STRUCT",
                 "_kjCondition,\"INLINE_COMPOSITE lists of non-STRUCT type are not supported.\"",
                 (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                 local_118,
                 (char (*) [61])"INLINE_COMPOSITE lists of non-STRUCT type are not supported.");
LAB_00199ca1:
      kj::_::Debug::Fault::~Fault((Fault *)local_e8);
      return 0;
    }
    paVar1 = &pWVar21->field_1;
    uVar2 = *(ushort *)paVar1;
    uVar3 = *(ushort *)((long)&pWVar21->field_1 + 2);
    elementSize.data = ((WireValue<WordCount16> *)paVar1)->value;
    elementSize.pointers = *(StructPointerCount *)((long)&paVar1->structRef + 2);
    local_e8._40_2_ = uVar3;
    uVar23 = (uint)uVar2 + (uint)uVar3;
    __return_storage_ptr__ = (Exception *)(ulong)uVar23;
    pEVar20 = (Exception *)(uVar17 * (long)__return_storage_ptr__);
    if ((Exception *)0x1fffffff < pEVar20) goto LAB_0019a3f7;
    uVar22 = (pWVar21->offsetAndKind).value >> 2 & 0x1fffffff;
    pEVar15 = (Exception *)((ulong)uVar22 * (long)__return_storage_ptr__);
    local_f0 = pEVar18;
    if ((Exception *)0x1fffffff < pEVar15) goto LAB_0019a3fc;
    pWVar16 = pWVar21 + 1;
    local_90._0_8_ = pWVar16 + (long)pEVar20;
    pDVar8 = (Disposer *)((long)&(pWVar16->offsetAndKind).value + (ulong)(uVar9 * 8));
    uVar24 = elementCount;
    if (elementCount <= uVar22) {
      while (local_e8._40_8_ = pDVar8, uVar24 != uVar22) {
        WireHelpers::zeroObject
                  ((SegmentBuilder *)local_138,this->capTable,pWVar21,
                   (word *)(pWVar16 + uVar17 * (long)__return_storage_ptr__));
        uVar24 = (int)uVar17 + 1;
        uVar17 = (ulong)uVar24;
        pDVar8 = (Disposer *)local_e8._40_8_;
      }
      *(int *)((long)&(local_f0->ownFile).content.ptr + 4) = (int)pEVar20 * 8 + 7;
      (pWVar21->offsetAndKind).value = elementCount << 2;
      pEVar18 = pEVar20;
      if ((local_138->next).ptr.disposer == (Disposer *)local_e8._40_8_) {
        (local_138->next).ptr.disposer = (Disposer *)local_90._0_8_;
      }
      goto LAB_00199ec1;
    }
    if (pEVar20 < pEVar11 || (long)pEVar20 - (long)pEVar11 == 0) {
      local_e8._0_8_ = pWVar16 + (long)pEVar15;
      local_118._0_8_ = local_90;
      local_118._8_8_ = local_e8;
      local_118._16_8_ = " >= ";
      local_100 = 5;
      local_f8 = CONCAT31(local_f8._1_3_,pEVar15 <= pEVar20);
      if (pEVar15 <= pEVar20) {
        uVar17 = (long)pEVar20 * 8 + (long)pEVar15 * -8;
        if ((int)(uVar17 >> 3) != 0) {
          memset((void *)local_e8._0_8_,0,uVar17 & 0xffffffff);
        }
        (pWVar21->offsetAndKind).value = elementCount << 2;
        pEVar18 = (Exception *)(ulong)(elementCount << 2);
        goto LAB_00199ec1;
      }
      goto LAB_0019a401;
    }
    if ((((local_138->next).ptr.disposer == pDVar8) &&
        ((ulong)(uVar9 * 8) <= (ulong)((long)pEVar20 * 8))) &&
       ((ulong)local_90._0_8_ <=
        (WirePointer *)
        ((word *)(local_138->description).content.ptr + (local_138->description).content.size_))) {
      (local_138->next).ptr.disposer = (Disposer *)local_90._0_8_;
      *(int *)((long)&(pEVar18->ownFile).content.ptr + 4) = (int)pEVar20 * 8 + 7;
      (pWVar21->offsetAndKind).value = elementCount << 2;
      goto LAB_00199ec1;
    }
    initStructList((OrphanBuilder *)(local_e8 + 0x38),
                   (BuilderArena *)((SegmentReader *)&local_138->file)->arena,this->capTable,
                   elementCount,elementSize);
    asStructList((ListBuilder *)local_118,(OrphanBuilder *)(local_e8 + 0x38),elementSize);
    uVar5 = local_118._16_8_;
    if (uVar22 != 0) {
      local_90._8_8_ = local_100 >> 0x20;
      local_f0 = (Exception *)local_118._0_8_;
      local_90._24_8_ = local_118._8_8_;
      local_e8._52_4_ = local_f8;
      local_90._16_8_ = ZEXT48(local_f8 >> 3);
      uVar26 = (ulong)uVar22;
      __return_storage_ptr__ = (Exception *)(ulong)(uVar23 * 8);
      uVar17 = 0;
      do {
        local_e8._16_8_ = uVar5 + (uVar17 >> 3);
        local_e8._0_8_ = local_f0;
        local_e8._8_8_ = local_90._24_8_;
        local_e8._24_8_ =
             (long)(_func_int ***)local_90._16_8_ +
             (long)&((ArrayDisposer *)local_e8._16_8_)->_vptr_ArrayDisposer;
        local_e8._32_4_ = local_e8._52_4_;
        local_e8._36_2_ = local_f4;
        pCStack_68 = this->capTable;
        pWStack_58 = pWVar16 + uVar2;
        local_90._32_8_ = local_138;
        uStack_4c = local_e8._40_2_;
        other_00.pointerCount = local_e8._40_2_;
        other_00.dataSize = (uint)uVar2 << 6;
        other_00._38_2_ = uStack_4a;
        other_00.capTable = pCStack_68;
        other_00.segment = (SegmentBuilder *)local_138;
        other_00.data = pWVar16;
        other_00.pointers = pWStack_58;
        local_60 = pWVar16;
        local_50 = (uint)uVar2 << 6;
        StructBuilder::transferContentFrom((StructBuilder *)local_e8,other_00);
        pWVar16 = (WirePointer *)((long)__return_storage_ptr__->trace + (long)(pWVar16 + -0xd));
        uVar17 = (long)(_func_int ***)local_90._8_8_ + uVar17;
        uVar26 = uVar26 - 1;
      } while (uVar26 != 0);
    }
    if (this->segment != (SegmentBuilder *)0x0) {
      euthanize(this);
    }
    this->segment = local_a8;
    this->capTable = (CapTableBuilder *)local_a0;
    this->location = local_98;
  }
  (this->tag).content = local_e8._56_8_;
  pEVar18 = __return_storage_ptr__;
LAB_00199ec1:
  return (int)CONCAT71((int7)((ulong)pEVar18 >> 8),1);
}

Assistant:

bool OrphanBuilder::truncate(ElementCount uncheckedSize, bool isText) {
  ListElementCount size = assertMaxBits<LIST_ELEMENT_COUNT_BITS>(uncheckedSize,
      []() { KJ_FAIL_REQUIRE("requested list size is too large"); });

  WirePointer* ref = tagAsPtr();
  SegmentBuilder* segment = this->segment;

  word* target = WireHelpers::followFars(ref, location, segment);

  if (ref->isNull()) {
    // We don't know the right element size, so we can't resize this list.
    return size == ZERO * ELEMENTS;
  }

  KJ_REQUIRE(ref->kind() == WirePointer::LIST, "Schema mismatch: Can't truncate non-list.") {
    return false;
  }

  if (isText) {
    // Add space for the NUL terminator.
    size = assertMaxBits<LIST_ELEMENT_COUNT_BITS>(size + ONE * ELEMENTS,
        []() { KJ_FAIL_REQUIRE("requested list size is too large"); });
  }

  auto elementSize = ref->listRef.elementSize();

  if (elementSize == ElementSize::INLINE_COMPOSITE) {
    auto oldWordCount = ref->listRef.inlineCompositeWordCount();

    WirePointer* tag = reinterpret_cast<WirePointer*>(target);
    ++target;
    KJ_REQUIRE(tag->kind() == WirePointer::STRUCT,
               "INLINE_COMPOSITE lists of non-STRUCT type are not supported.") {
      return false;
    }
    StructSize structSize(tag->structRef.dataSize.get(), tag->structRef.ptrCount.get());
    auto elementStep = structSize.total() / ELEMENTS;

    auto oldSize = tag->inlineCompositeListElementCount();

    SegmentWordCount sizeWords = assertMaxBits<SEGMENT_WORD_COUNT_BITS>(
        upgradeBound<uint64_t>(size) * elementStep,
        []() { KJ_FAIL_ASSERT("requested list size too large to fit in message segment"); });
    SegmentWordCount oldSizeWords = assertMaxBits<SEGMENT_WORD_COUNT_BITS>(
        upgradeBound<uint64_t>(oldSize) * elementStep,
        []() { KJ_FAIL_ASSERT("prior to truncate, list is larger than max segment size?"); });

    word* newEndWord = target + sizeWords;
    word* oldEndWord = target + oldWordCount;

    if (size <= oldSize) {
      // Zero the trailing elements.
      for (auto i: kj::range(size, oldSize)) {
        // assumeBits() safe because we checked that both sizeWords and oldSizeWords are in-range
        // above.
        WireHelpers::zeroObject(segment, capTable, tag, target +
            assumeBits<SEGMENT_WORD_COUNT_BITS>(upgradeBound<uint64_t>(i) * elementStep));
      }
      ref->listRef.setInlineComposite(sizeWords);
      tag->setKindAndInlineCompositeListElementCount(WirePointer::STRUCT, size);
      segment->tryTruncate(oldEndWord, newEndWord);
    } else if (newEndWord <= oldEndWord) {
      // Apparently the old list was over-allocated? The word count is more than needed to store
      // the elements. This is "valid" but shouldn't happen in practice unless someone is toying
      // with us.
      word* expectedEnd = target + oldSizeWords;
      KJ_ASSERT(newEndWord >= expectedEnd);
      WireHelpers::zeroMemory(expectedEnd,
          intervalLength(expectedEnd, newEndWord, MAX_SEGMENT_WORDS));
      tag->setKindAndInlineCompositeListElementCount(WirePointer::STRUCT, size);
    } else {
      if (segment->tryExtend(oldEndWord, newEndWord)) {
        // Done in-place. Nothing else to do now; the new memory is already zero'd.
        ref->listRef.setInlineComposite(sizeWords);
        tag->setKindAndInlineCompositeListElementCount(WirePointer::STRUCT, size);
      } else {
        // Need to re-allocate and transfer.
        OrphanBuilder replacement = initStructList(segment->getArena(), capTable, size, structSize);

        ListBuilder newList = replacement.asStructList(structSize);
        for (auto i: kj::zeroTo(oldSize)) {
          // assumeBits() safe because we checked that both sizeWords and oldSizeWords are in-range
          // above.
          word* element = target +
              assumeBits<SEGMENT_WORD_COUNT_BITS>(upgradeBound<uint64_t>(i) * elementStep);
          newList.getStructElement(i).transferContentFrom(
              StructBuilder(segment, capTable, element,
                            reinterpret_cast<WirePointer*>(element + structSize.data),
                            structSize.data * BITS_PER_WORD, structSize.pointers));
        }

        *this = kj::mv(replacement);
      }
    }
  } else if (elementSize == ElementSize::POINTER) {
    // TODO(cleanup): GCC won't let me declare this constexpr, claiming POINTERS is not constexpr,
    //   but it is?
    const auto POINTERS_PER_ELEMENT = ONE * POINTERS / ELEMENTS;

    auto oldSize = ref->listRef.elementCount();
    word* newEndWord = target + size * POINTERS_PER_ELEMENT * WORDS_PER_POINTER;
    word* oldEndWord = target + oldSize * POINTERS_PER_ELEMENT * WORDS_PER_POINTER;

    if (size <= oldSize) {
      // Zero the trailing elements.
      for (WirePointer* element = reinterpret_cast<WirePointer*>(newEndWord);
           element < reinterpret_cast<WirePointer*>(oldEndWord); ++element) {
        WireHelpers::zeroPointerAndFars(segment, element);
      }
      ref->listRef.set(ElementSize::POINTER, size);
      segment->tryTruncate(oldEndWord, newEndWord);
    } else {
      if (segment->tryExtend(oldEndWord, newEndWord)) {
        // Done in-place. Nothing else to do now; the new memory is already zero'd.
        ref->listRef.set(ElementSize::POINTER, size);
      } else {
        // Need to re-allocate and transfer.
        OrphanBuilder replacement = initList(
            segment->getArena(), capTable, size, ElementSize::POINTER);
        ListBuilder newList = replacement.asList(ElementSize::POINTER);
        WirePointer* oldPointers = reinterpret_cast<WirePointer*>(target);
        for (auto i: kj::zeroTo(oldSize)) {
          newList.getPointerElement(i).transferFrom(
              PointerBuilder(segment, capTable, oldPointers + i * POINTERS_PER_ELEMENT));
        }
        *this = kj::mv(replacement);
      }
    }
  } else {
    auto oldSize = ref->listRef.elementCount();
    auto step = dataBitsPerElement(elementSize);
    const auto MAX_STEP_BYTES = ONE * WORDS / ELEMENTS * BYTES_PER_WORD;
    word* newEndWord = target + WireHelpers::roundBitsUpToWords(
        upgradeBound<uint64_t>(size) * step);
    word* oldEndWord = target + WireHelpers::roundBitsUpToWords(
        upgradeBound<uint64_t>(oldSize) * step);

    if (size <= oldSize) {
      // When truncating text, we want to set the null terminator as well, so we'll do our zeroing
      // at the byte level.
      byte* begin = reinterpret_cast<byte*>(target);
      byte* newEndByte = begin + WireHelpers::roundBitsUpToBytes(
          upgradeBound<uint64_t>(size) * step) - isText;
      byte* oldEndByte = reinterpret_cast<byte*>(oldEndWord);

      WireHelpers::zeroMemory(newEndByte,
          intervalLength(newEndByte, oldEndByte, MAX_LIST_ELEMENTS * MAX_STEP_BYTES));
      ref->listRef.set(elementSize, size);
      segment->tryTruncate(oldEndWord, newEndWord);
    } else {
      // We're trying to extend, not truncate.
      if (segment->tryExtend(oldEndWord, newEndWord)) {
        // Done in-place. Nothing else to do now; the memory is already zero'd.
        ref->listRef.set(elementSize, size);
      } else {
        // Need to re-allocate and transfer.
        OrphanBuilder replacement = initList(segment->getArena(), capTable, size, elementSize);
        ListBuilder newList = replacement.asList(elementSize);
        auto words = WireHelpers::roundBitsUpToWords(
            dataBitsPerElement(elementSize) * upgradeBound<uint64_t>(oldSize));
        WireHelpers::copyMemory(reinterpret_cast<word*>(newList.ptr), target, words);
        *this = kj::mv(replacement);
      }
    }
  }

  return true;
}